

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O3

bool __thiscall r_exec::SGMonitor::reduce(SGMonitor *this,_Fact *input)

{
  bool success;
  short sVar1;
  int iVar2;
  int iVar3;
  MatchResult MVar4;
  Pred *this_00;
  Sim *sim;
  undefined4 extraout_var;
  _Fact *this_01;
  Goal *affected_goal;
  _func_int **pp_Var6;
  undefined8 uVar7;
  _Object *p_Var8;
  MDLController *pMVar9;
  long *plVar5;
  
  iVar2 = (*((this->super__GMonitor).super_Monitor.target.object)->_vptr__Object[0xe])();
  if (SUB41(iVar2,0) == false) {
    this_00 = _Fact::get_pred(input);
    if (this_00 != (Pred *)0x0) {
      input = Pred::get_target(this_00);
      sim = Pred::get_simulation
                      (this_00,(Controller *)(this->super__GMonitor).super_Monitor.target.object);
      if (sim != (Sim *)0x0) {
        iVar3 = (*(input->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(input,0);
        plVar5 = (long *)CONCAT44(extraout_var,iVar3);
        (**(code **)(*plVar5 + 0x20))(plVar5,0);
        sVar1 = r_code::Atom::asOpcode();
        if (sVar1 == Opcodes::Success) {
          this_01 = (_Fact *)(**(code **)(*plVar5 + 0x48))(plVar5,1);
          affected_goal = _Fact::get_goal(this_01);
          if (affected_goal != (Goal *)0x0) {
            success = _Fact::is_fact(input);
            _GMonitor::store_simulated_outcome(&this->super__GMonitor,affected_goal,sim,success);
            return false;
          }
        }
      }
    }
    MVar4 = _Fact::is_evidence(input,(this->super__GMonitor).goal_target);
    if (MVar4 != MATCH_FAILURE) {
      if (MVar4 == MATCH_SUCCESS_NEGATIVE) {
        p_Var8 = (this->super__GMonitor).super_Monitor.target.object;
        pMVar9 = (this->super__GMonitor).super_Monitor.controller;
        pp_Var6 = (pMVar9->super_HLPController).super_OController.super_Controller.super__Object.
                  _vptr__Object;
        uVar7 = 0;
      }
      else {
        if (MVar4 != MATCH_SUCCESS_POSITIVE) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"reached invalid state!",0x16);
          return false;
        }
        p_Var8 = (this->super__GMonitor).super_Monitor.target.object;
        pMVar9 = (this->super__GMonitor).super_Monitor.controller;
        pp_Var6 = (pMVar9->super_HLPController).super_OController.super_Controller.super__Object.
                  _vptr__Object;
        uVar7 = 1;
      }
      (*pp_Var6[0x10])(pMVar9,p_Var8,uVar7,input);
    }
  }
  return SUB41(iVar2,0);
}

Assistant:

bool SGMonitor::reduce(_Fact *input)
{
    if (target->is_invalidated()) {
        return true;
    }

    _Fact *_input;
    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _input = prediction->get_target(); // _input is f1->obj.
        Sim *sim = prediction->get_simulation(target);

        if (sim) {
            Code *outcome = _input->get_reference(0);

            if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                Goal *affected_goal = f_success->get_goal();

                if (affected_goal) {
                    store_simulated_outcome(affected_goal, sim, _input->is_fact());
                    return false;
                }
            }
        }
    } else {
        _input = input;
    }

    // Non-simulated input (can be actual or predicted): report the simulated outcome: this will inject a simulated prediction of the outcome, to allow any g-monitor deciding on this ground.
    switch (_input->is_evidence(goal_target)) {
    case MATCH_SUCCESS_POSITIVE:
        ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, _input); // report a simulated success.
        return false;

    case MATCH_SUCCESS_NEGATIVE:
        ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, _input); // report a simulated failure.
        return false;

    case MATCH_FAILURE:
        return false;
    }

    std::cerr << "reached invalid state!";
    return false;
}